

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

int xmlStreamPop(xmlStreamCtxtPtr stream)

{
  int iVar1;
  int local_1c;
  int lev;
  int i;
  xmlStreamCtxtPtr stream_local;
  
  _lev = stream;
  if (stream == (xmlStreamCtxtPtr)0x0) {
    stream_local._4_4_ = -1;
  }
  else {
    for (; _lev != (xmlStreamCtxtPtr)0x0; _lev = _lev->next) {
      if (_lev->blockLevel == _lev->level) {
        _lev->blockLevel = -1;
      }
      if (_lev->level != 0) {
        _lev->level = _lev->level + -1;
      }
      local_1c = _lev->nbState;
      do {
        local_1c = local_1c + -1;
        if (local_1c < 0) break;
        iVar1 = _lev->states[local_1c * 2 + 1];
        if (_lev->level < iVar1) {
          _lev->nbState = _lev->nbState + -1;
        }
      } while (_lev->level < iVar1);
    }
    stream_local._4_4_ = 0;
  }
  return stream_local._4_4_;
}

Assistant:

int
xmlStreamPop(xmlStreamCtxtPtr stream) {
    int i, lev;

    if (stream == NULL)
        return(-1);
    while (stream != NULL) {
	/*
	* Reset block-level.
	*/
	if (stream->blockLevel == stream->level)
	    stream->blockLevel = -1;

	/*
	 *  stream->level can be zero when XML_FINAL_IS_ANY_NODE is set
	 *  (see the thread at
	 *  http://mail.gnome.org/archives/xslt/2008-July/msg00027.html)
	 */
	if (stream->level)
	    stream->level--;
	/*
	 * Check evolution of existing states
	 */
	for (i = stream->nbState -1; i >= 0; i--) {
	    /* discard obsoleted states */
	    lev = stream->states[(2 * i) + 1];
	    if (lev > stream->level)
		stream->nbState--;
	    if (lev <= stream->level)
		break;
	}
	stream = stream->next;
    }
    return(0);
}